

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectFlatLoop<float,float,duckdb::NotEquals,false,true,false,true>
                (float *ldata,float *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  bool bVar4;
  ulong uVar5;
  sel_t sVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  if (count + 0x3f < 0x40) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    uVar9 = 0;
    uVar11 = 0;
    do {
      puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar7 = count;
        }
LAB_00eecda8:
        uVar5 = uVar11;
        if (uVar11 < uVar7) {
          pfVar8 = ldata + uVar11;
          do {
            uVar13 = uVar11;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar13 = (ulong)sel->sel_vector[uVar11];
            }
            bVar4 = duckdb::Equals::Operation<float>(pfVar8,rdata);
            false_sel->sel_vector[lVar12] = (sel_t)uVar13;
            lVar12 = lVar12 + (ulong)bVar4;
            uVar11 = uVar11 + 1;
            pfVar8 = pfVar8 + 1;
            uVar5 = uVar7;
          } while (uVar7 != uVar11);
        }
      }
      else {
        uVar13 = puVar1[uVar9];
        uVar7 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar7 = count;
        }
        if (uVar13 == 0xffffffffffffffff) goto LAB_00eecda8;
        uVar5 = uVar7;
        if (uVar13 == 0) {
          if (uVar11 < uVar7) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              sVar6 = (sel_t)uVar11;
              if (psVar2 != (sel_t *)0x0) {
                sVar6 = psVar2[uVar11];
              }
              psVar3[lVar12] = sVar6;
              lVar12 = lVar12 + 1;
              uVar11 = uVar11 + 1;
            } while (uVar7 != uVar11);
          }
        }
        else {
          uVar5 = uVar11;
          if (uVar11 < uVar7) {
            pfVar8 = ldata + uVar11;
            uVar10 = 0;
            do {
              if (sel->sel_vector == (sel_t *)0x0) {
                sVar6 = (int)uVar10 + (int)uVar11;
              }
              else {
                sVar6 = sel->sel_vector[uVar11 + uVar10];
              }
              if ((uVar13 >> (uVar10 & 0x3f) & 1) == 0) {
                uVar5 = 1;
              }
              else {
                bVar4 = duckdb::Equals::Operation<float>(pfVar8,rdata);
                uVar5 = (ulong)bVar4;
              }
              false_sel->sel_vector[lVar12] = sVar6;
              lVar12 = lVar12 + uVar5;
              uVar10 = uVar10 + 1;
              pfVar8 = pfVar8 + 1;
              uVar5 = uVar7;
            } while (uVar7 - uVar11 != uVar10);
          }
        }
      }
      uVar9 = uVar9 + 1;
      uVar11 = uVar5;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return count - lVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}